

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O3

ShaderProgram * __thiscall
deqp::gles31::Functional::anon_unknown_1::UBOBindingRenderCase::generateShaders
          (UBOBindingRenderCase *this)

{
  char *pcVar1;
  ShaderType SVar2;
  RenderContext *renderCtx;
  ostream *poVar3;
  ShaderProgram *this_00;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  undefined8 uVar8;
  char *pcVar9;
  _Alloc_hider _Var10;
  int declNdx;
  ulong uVar11;
  string uname;
  ostringstream shaderBody;
  ostringstream shaderUniformDecl;
  undefined1 local_5e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d8;
  uint local_5c0;
  undefined4 uStack_5bc;
  value_type local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  undefined1 local_498 [112];
  ios_base local_428 [32];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_408;
  undefined1 local_3e8 [200];
  undefined1 local_320 [376];
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  uVar7 = (this->super_LayoutBindingRenderCase).m_numBindings;
  uVar4 = (this->super_LayoutBindingRenderCase).m_testType - TESTTYPE_BINDING_ARRAY;
  uVar5 = 1;
  if (1 < uVar4) {
    uVar5 = uVar7;
  }
  if (0 < (int)uVar5) {
    uVar11 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(std140, binding = ",0x19);
      poVar3 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)local_1a8,
                          (this->super_LayoutBindingRenderCase).m_bindings.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar11]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") uniform ",10);
      declNdx = (int)uVar11;
      getUniformName((string *)local_498,&(this->super_LayoutBindingRenderCase).m_uniformName,
                     declNdx);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(char *)local_498._0_8_,local_498._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\thighp vec4 color1;\n",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\thighp vec4 color2;\n",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"} ",2);
      if (uVar4 < 2) {
        local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"colors","");
        getUniformName((string *)local_5e8,&local_578,declNdx,
                       (this->super_LayoutBindingRenderCase).m_numBindings);
      }
      else {
        local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"colors","");
        getUniformName((string *)local_5e8,&local_598,declNdx);
      }
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(char *)CONCAT44(local_5e8._4_4_,local_5e8._0_4_),local_5e8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,";\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_5e8._4_4_,local_5e8._0_4_) != &local_5d8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_5e8._4_4_,local_5e8._0_4_),
                        local_5d8._M_allocated_capacity + 1);
      }
      if (uVar4 < 2) {
        uVar8 = local_578.field_2._M_allocated_capacity;
        _Var10._M_p = local_578._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578._M_dataplus._M_p != &local_578.field_2) {
LAB_0144d135:
          operator_delete(_Var10._M_p,uVar8 + 1);
        }
      }
      else {
        uVar8 = local_598.field_2._M_allocated_capacity;
        _Var10._M_p = local_598._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._M_dataplus._M_p != &local_598.field_2) goto LAB_0144d135;
      }
      if ((undefined1 *)local_498._0_8_ != local_498 + 0x10) {
        operator_delete((void *)local_498._0_8_,local_498._16_8_ + 1);
      }
      uVar11 = uVar11 + 1;
    } while (uVar5 != uVar11);
    uVar7 = (this->super_LayoutBindingRenderCase).m_numBindings;
  }
  if (0 < (int)(uVar7 * 2)) {
    pcVar1 = local_498 + 0x10;
    uVar7 = 0;
    do {
      local_498._0_8_ = pcVar1;
      if (uVar4 < 2) {
        std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"colors","");
        getUniformName((string *)local_5e8,(string *)local_498,0,uVar7 >> 1);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"colors","");
        getUniformName((string *)local_5e8,(string *)local_498,uVar7 >> 1);
      }
      if ((char *)local_498._0_8_ != pcVar1) {
        operator_delete((void *)local_498._0_8_,local_498._16_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\t",1);
      pcVar9 = "else if";
      if (uVar7 == 0) {
        pcVar9 = "if";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,pcVar9,(ulong)(uVar7 != 0) * 5 + 2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320," (u_arrayNdx == ",0x10);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
      std::ostream::operator<<((string *)local_498,uVar7);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
      std::ios_base::~ios_base(local_428);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_320,(char *)CONCAT44(uStack_5bc,local_5c0),
                          (long)local_5b8._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t{\n",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t\tcolor = ",10);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(char *)CONCAT44(local_5e8._4_4_,local_5e8._0_4_),local_5e8._8_8_);
      pcVar9 = ".color2";
      if ((uVar7 & 1) == 0) {
        pcVar9 = ".color1";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar9,7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,";\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t}\n",3);
      if ((size_type *)CONCAT44(uStack_5bc,local_5c0) != &local_5b8._M_string_length) {
        operator_delete((undefined1 *)CONCAT44(uStack_5bc,local_5c0),local_5b8._M_string_length + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_5e8._4_4_,local_5e8._0_4_) != &local_5d8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_5e8._4_4_,local_5e8._0_4_),
                        local_5d8._M_allocated_capacity + 1);
      }
      uVar7 = uVar7 + 1;
    } while ((int)uVar7 < (this->super_LayoutBindingRenderCase).m_numBindings * 2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\telse\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\t{\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"\t\tcolor = vec4(0.0, 0.0, 0.0, 1.0);\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\t}\n",3);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx;
  memset(local_498,0,0xac);
  local_3e8._0_8_ = (pointer)0x0;
  local_3e8[8] = 0;
  local_3e8._9_7_ = 0;
  local_3e8[0x10] = 0;
  local_3e8._17_8_ = 0;
  SVar2 = (this->super_LayoutBindingRenderCase).m_shaderType;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateVertexShader(&local_538,SVar2,&local_4b8,&local_4d8);
  local_5e8._0_4_ = 0;
  local_5e8._8_8_ = local_5d8._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_5e8 + 8),local_538._M_dataplus._M_p,
             local_538._M_dataplus._M_p + local_538._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_498 + (ulong)(uint)local_5e8._0_4_ * 0x18),(value_type *)(local_5e8 + 8));
  SVar2 = (this->super_LayoutBindingRenderCase).m_shaderType;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateFragmentShader(&local_558,SVar2,&local_4f8,&local_518);
  local_5c0 = 1;
  local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5b8,local_558._M_dataplus._M_p,
             local_558._M_dataplus._M_p + local_558._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_498 + (ulong)local_5c0 * 0x18),&local_5b8);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != &local_558.field_2) {
    operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_5e8._8_8_ != local_5d8._M_local_buf + 8) {
    operator_delete((void *)local_5e8._8_8_,local_5d8._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3e8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_408);
  lVar6 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_498 + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return this_00;
}

Assistant:

glu::ShaderProgram* UBOBindingRenderCase::generateShaders (void) const
{
	std::ostringstream		shaderUniformDecl;
	std::ostringstream		shaderBody;
	const bool				arrayInstance	= (m_testType == TESTTYPE_BINDING_ARRAY || m_testType == TESTTYPE_BINDING_MAX_ARRAY);
	const int				numDeclarations = (arrayInstance ? 1 : m_numBindings);

	// Generate the uniform declarations for the vertex and fragment shaders
	for (int declNdx = 0; declNdx < numDeclarations; ++declNdx)
	{
		shaderUniformDecl << "layout(std140, binding = " << m_bindings[declNdx] << ") uniform "
			<< getUniformName(m_uniformName, declNdx) << "\n"
			<< "{\n"
			<< "	highp vec4 color1;\n"
			<< "	highp vec4 color2;\n"
			<< "} " << (arrayInstance ? getUniformName("colors", declNdx, m_numBindings) : getUniformName("colors", declNdx)) << ";\n";
	}

	// Generate the shader body for the vertex and fragment shaders
	for (int bindNdx = 0; bindNdx < m_numBindings*2; ++bindNdx)	// Multiply by two to cover cases for both colors for each UBO
	{
		const std::string uname = (arrayInstance ? getUniformName("colors", 0, bindNdx/2) : getUniformName("colors", bindNdx/2));
		shaderBody	<< "	" << (bindNdx == 0 ? "if" : "else if") << " (u_arrayNdx == " << de::toString(bindNdx) << ")\n"
					<< "	{\n"
					<< "		color = " << uname << (bindNdx%2 == 0 ? ".color1" : ".color2") << ";\n"
					<< "	}\n";
	}

	shaderBody	<< "	else\n"
				<< "	{\n"
				<< "		color = vec4(0.0, 0.0, 0.0, 1.0);\n"
				<< "	}\n";

	return new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
					<< glu::VertexSource(generateVertexShader(m_shaderType, shaderUniformDecl.str(), shaderBody.str()))
					<< glu::FragmentSource(generateFragmentShader(m_shaderType, shaderUniformDecl.str(), shaderBody.str())));
}